

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void wr_description(void)

{
  char buf [1024];
  
  if (player->is_dead == true) {
    strnfmt(buf,0x400,"%s, dead (%s)",player->full_name,player->died_from);
  }
  else {
    strnfmt(buf,0x400,"%s, L%d %s %s, at DL%d",player->full_name,(ulong)(uint)(int)player->lev,
            player->race->name,player->class->name,(ulong)(uint)(int)player->depth);
  }
  wr_string(buf);
  return;
}

Assistant:

void wr_description(void)
{
	char buf[1024];

	if (player->is_dead)
		strnfmt(buf, sizeof buf, "%s, dead (%s)",
				player->full_name,
				player->died_from);
	else
		strnfmt(buf, sizeof buf, "%s, L%d %s %s, at DL%d",
				player->full_name,
				player->lev,
				player->race->name,
				player->class->name,
				player->depth);

	wr_string(buf);
}